

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_label.h
# Opt level: O3

result_type __thiscall
std::hash<label::JSONLabel>::operator()(hash<label::JSONLabel> *this,argument_type *s)

{
  long *plVar1;
  ulong uVar2;
  uint __val;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  undefined8 *puVar7;
  result_type rVar8;
  uint uVar9;
  ulong uVar10;
  string __str;
  long *local_78;
  long local_68;
  undefined8 uStack_60;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  ulong *local_38;
  uint local_30;
  undefined4 uStack_2c;
  ulong local_28 [2];
  
  pcVar3 = (s->label_)._M_dataplus._M_p;
  local_58 = local_48;
  __cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (s->label_)._M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  __val = s->type_;
  cVar6 = '\x01';
  if (9 < __val) {
    uVar9 = __val;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar9 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_0010976d;
      }
      if (uVar9 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_0010976d;
      }
      if (uVar9 < 10000) goto LAB_0010976d;
      bVar4 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar4);
    cVar6 = cVar6 + '\x01';
  }
LAB_0010976d:
  local_38 = local_28;
  std::__cxx11::string::_M_construct((ulong)&local_38,cVar6);
  __detail::__to_chars_10_impl<unsigned_int>((char *)local_38,local_30,__val);
  uVar2 = CONCAT44(uStack_2c,local_30) + local_50;
  uVar10 = 0xf;
  if (local_58 != local_48) {
    uVar10 = local_48[0];
  }
  if (uVar10 < uVar2) {
    uVar10 = 0xf;
    if (local_38 != local_28) {
      uVar10 = local_28[0];
    }
    if (uVar2 <= uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,(ulong)local_58);
      goto LAB_001097ee;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_38);
LAB_001097ee:
  local_78 = &local_68;
  plVar1 = puVar7 + 2;
  if ((long *)*puVar7 == plVar1) {
    local_68 = *plVar1;
    uStack_60 = puVar7[3];
  }
  else {
    local_68 = *plVar1;
    local_78 = (long *)*puVar7;
  }
  uVar2 = puVar7[1];
  *puVar7 = plVar1;
  puVar7[1] = 0;
  *(undefined1 *)plVar1 = 0;
  rVar8 = std::_Hash_bytes(local_78,uVar2,0xc70f6907);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return rVar8;
}

Assistant:

result_type operator()(argument_type const& s) const noexcept {
        result_type const h ( std::hash<std::string>{}(s.to_string() + "hash" + 
            std::to_string(s.get_type())) );
        return h;
    }